

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observers.cpp
# Opt level: O3

int main(void)

{
  ObserverB b;
  ObserverC c;
  ObserverA a;
  O o;
  int local_c4;
  Observer local_c0;
  bool local_b8 [4];
  int local_b4;
  Observer local_b0;
  bool local_a8 [4];
  int local_a4 [3];
  Observer local_98;
  bool local_90 [8];
  __native_type local_88;
  undefined5 uStack_60;
  undefined3 local_5b;
  undefined5 uStack_58;
  undefined8 uStack_53;
  condition_variable local_48 [56];
  
  uStack_58 = 0;
  uStack_53 = 0;
  local_88.__data.__list.__next = (__pthread_internal_list *)0x0;
  uStack_60 = 0;
  local_5b = 0;
  local_88._16_8_ = 0;
  local_88.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_88.__align = 0;
  local_88._8_8_ = 0;
  std::condition_variable::condition_variable(local_48);
  local_98._vptr_Observer = (_func_int **)&PTR__Observer_00104cc8;
  local_90[0] = false;
  local_c0._vptr_Observer = (_func_int **)&PTR__Observer_00104d28;
  local_b8[0] = false;
  local_b4 = -1;
  local_b0._vptr_Observer = (_func_int **)&PTR__Observer_00104d78;
  local_a8[0] = false;
  local_a4[0] = -1;
  local_a4[1] = -1;
  obs::safe_list<Observer>::push_back((safe_list<Observer> *)&local_88.__data,&local_98);
  obs::safe_list<Observer>::push_back((safe_list<Observer> *)&local_88.__data,&local_c0);
  obs::safe_list<Observer>::push_back((safe_list<Observer> *)&local_88.__data,&local_b0);
  obs::observers<Observer>::notify_observers<>((observers<Observer> *)&local_88.__data,0x11);
  local_c4._0_1_ = true;
  expect_eq<bool,bool>
            ((bool *)&local_c4,local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x3f);
  local_c4._0_1_ = false;
  expect_eq<bool,bool>
            ((bool *)&local_c4,local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x40);
  local_c4._0_1_ = false;
  expect_eq<bool,bool>
            ((bool *)&local_c4,local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x41);
  obs::observers<Observer>::notify_observers<int>((observers<Observer> *)&local_88.__data,0x19,0);
  local_c4._0_1_ = true;
  expect_eq<bool,bool>
            ((bool *)&local_c4,local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x44);
  local_c4 = (uint)local_c4._1_3_ << 8;
  expect_eq<bool,bool>
            ((bool *)&local_c4,local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x45);
  local_c4 = 1;
  expect_eq<int,int>(&local_c4,&local_b4,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
                     ,0x46);
  obs::observers<Observer>::notify_observers<int,int>
            ((observers<Observer> *)&local_88.__data,0x21,0,1);
  local_c4._0_1_ = true;
  expect_eq<bool,bool>
            ((bool *)&local_c4,local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x49);
  local_c4 = CONCAT31(local_c4._1_3_,1);
  expect_eq<bool,bool>
            ((bool *)&local_c4,local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x4a);
  local_c4 = 1;
  expect_eq<int,int>(&local_c4,local_a4,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
                     ,0x4b);
  local_c4 = 2;
  expect_eq<int,int>(&local_c4,local_a4 + 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
                     ,0x4c);
  obs::safe_list<Observer>::~safe_list((safe_list<Observer> *)&local_88.__data);
  return 0;
}

Assistant:

int main() {
  O o;
  ObserverA a;
  ObserverB b;
  ObserverC c;
  o.add_observer(&a);
  o.add_observer(&b);
  o.add_observer(&c);

  o.notify_observers(&Observer::on_event_a);
  EXPECT_TRUE(a.a);
  EXPECT_FALSE(b.b);
  EXPECT_FALSE(c.c);

  o.notify_observers(&Observer::on_event_b, 1);
  EXPECT_TRUE(b.b);
  EXPECT_FALSE(c.c);
  EXPECT_EQ(1, b.a_arg);

  o.notify_observers(&Observer::on_event_c, 1, 2);
  EXPECT_TRUE(b.b);
  EXPECT_TRUE(c.c);
  EXPECT_EQ(1, c.a_arg);
  EXPECT_EQ(2, c.b_arg);
}